

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr *pp_Var3;
  char cVar4;
  void *pvVar5;
  long lVar6;
  _List_node_base *p_Var7;
  double dVar8;
  _List_node_base *p_Var9;
  int iVar10;
  int iVar11;
  undefined8 *puVar12;
  Station *pSVar13;
  EvaluationFunction *ev;
  ostream *poVar14;
  _Base_ptr p_Var15;
  int i_1;
  int iVar16;
  ulong uVar17;
  undefined8 *puVar18;
  long lVar19;
  int i;
  initializer_list<args::EitherFlag> in;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  double local_6c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  organ_files;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  coord_files;
  vector<double,_std::allocator<double>_> Zmax;
  vector<double,_std::allocator<double>_> Zmin;
  set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  sb;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  vector<double,_std::allocator<double>_> w;
  string file;
  string local_5c8;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  Plan P;
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file;
  Collimator collimator;
  ArgumentParser parser;
  HelpFlag help;
  
  pp_Var1 = &collimator.beam_coord._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  collimator.beam_coord._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&collimator,"********* IMRT-Solver *********","");
  p_Var2 = &P.angle2station._M_t._M_impl.super__Rb_tree_header;
  P._vptr_Plan = (_func_int **)p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&P,"An IMRT Solver.","");
  args::ArgumentParser::ArgumentParser(&parser,(string *)&collimator,(string *)&P);
  if ((_Rb_tree_header *)P._vptr_Plan != p_Var2) {
    operator_delete(P._vptr_Plan);
  }
  if ((_Base_ptr *)collimator.beam_coord._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)collimator.beam_coord._M_t._M_impl._0_8_);
  }
  _file.super_PositionalBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&_file.super_PositionalBase.super_NamedBase.super_Base.help;
  std::__cxx11::string::_M_construct<char_const*>((string *)&_file,"help","");
  pp_Var3 = &sb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sb._M_t._M_impl._0_8_ = pp_Var3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sb,"Display this help menu","");
  P.angle2station._M_t._M_impl._0_8_ =
       &P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  P._vptr_Plan = (_func_int **)CONCAT62(P._vptr_Plan._2_6_,0x6801);
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ = 0;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_2_ = 0;
  P.angle2station._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&P.stations.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                _M_impl._M_node.super__List_node_base._M_prev;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&P.angle2station._M_t._M_impl.super__Rb_tree_header._M_node_count,"help","");
  in._M_len = 2;
  in._M_array = (iterator)&P;
  args::Matcher::Matcher((Matcher *)&collimator,in);
  args::Flag::Flag(&help.super_Flag,&parser.super_Group,(string *)&_file,(string *)&sb,
                   (Matcher *)&collimator,false);
  help.super_Flag.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__FlagBase_0012b9f8;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&collimator.angle_coord._M_t._M_impl.super__Rb_tree_header);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&collimator);
  lVar19 = 0;
  do {
    pvVar5 = *(void **)((long)&P.angle2station._M_t._M_impl.super__Rb_tree_header._M_node_count +
                       lVar19);
    if ((void *)((long)&P.stations.
                        super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
                        _M_node.super__List_node_base._M_prev + lVar19) != pvVar5) {
      operator_delete(pvVar5);
    }
    lVar19 = lVar19 + -0x28;
  } while (lVar19 != -0x50);
  if ((_Base_ptr *)sb._M_t._M_impl._0_8_ != pp_Var3) {
    operator_delete((void *)sb._M_t._M_impl._0_8_);
  }
  if ((string *)_file.super_PositionalBase.super_NamedBase.super_Base._vptr_Base !=
      &_file.super_PositionalBase.super_NamedBase.super_Base.help) {
    operator_delete(_file.super_PositionalBase.super_NamedBase.super_Base._vptr_Base);
  }
  collimator.beam_coord._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&collimator,"instance","");
  P._vptr_Plan = (_func_int **)p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&P,"Instance","");
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)sb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  sb._M_t._M_impl._0_8_ = pp_Var3;
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Positional(&_file,&parser.super_Group,(string *)&collimator,(string *)&P,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sb);
  if ((_Base_ptr *)sb._M_t._M_impl._0_8_ != pp_Var3) {
    operator_delete((void *)sb._M_t._M_impl._0_8_);
  }
  if ((_Rb_tree_header *)P._vptr_Plan != p_Var2) {
    operator_delete(P._vptr_Plan);
  }
  if ((_Base_ptr *)collimator.beam_coord._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)collimator.beam_coord._M_t._M_impl._0_8_);
  }
  args::ArgumentParser::ParseCLI(&parser,argc,argv);
  file._M_dataplus._M_p = (pointer)&file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&file,_file.value._M_dataplus._M_p,
             _file.value._M_dataplus._M_p + _file.value._M_string_length);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&coord_files,5,(allocator_type *)&collimator);
  (coord_files.
   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->first = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&(coord_files.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->second,0,
             (char *)((coord_files.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->second)._M_string_length,0x12009e
            );
  coord_files.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].first = 0x46;
  std::__cxx11::string::_M_replace
            ((ulong)&coord_files.
                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].second,0,
             (char *)coord_files.
                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].second._M_string_length,0x1200c7);
  coord_files.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[2].first = 0x8c;
  std::__cxx11::string::_M_replace
            ((ulong)&coord_files.
                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].second,0,
             (char *)coord_files.
                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].second._M_string_length,0x1200f1);
  coord_files.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3].first = 0xd2;
  std::__cxx11::string::_M_replace
            ((ulong)&coord_files.
                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[3].second,0,
             (char *)coord_files.
                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[3].second._M_string_length,0x12011c);
  coord_files.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[4].first = 0x118;
  std::__cxx11::string::_M_replace
            ((ulong)&coord_files.
                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[4].second,0,
             (char *)coord_files.
                     super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[4].second._M_string_length,0x120147);
  organ_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  organ_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  organ_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  collimator.beam_coord._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&collimator,"data/CERR_Prostate/DAO_DDM_BLADDER.dat","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&organ_files,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collimator);
  if ((_Base_ptr *)collimator.beam_coord._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)collimator.beam_coord._M_t._M_impl._0_8_);
  }
  collimator.beam_coord._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&collimator,"data/CERR_Prostate/DAO_DDM_RECTUM.dat","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&organ_files,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collimator);
  if ((_Base_ptr *)collimator.beam_coord._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)collimator.beam_coord._M_t._M_impl._0_8_);
  }
  collimator.beam_coord._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&collimator,"data/CERR_Prostate/DAO_DDM_PTVHD.dat","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&organ_files,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collimator);
  if ((_Base_ptr *)collimator.beam_coord._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)collimator.beam_coord._M_t._M_impl._0_8_);
  }
  imrt::Collimator::Collimator(&collimator,&coord_files);
  volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  volumes.super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (organ_files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      organ_files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar19 = 8;
    uVar17 = 0;
    do {
      lVar6 = *(long *)((long)organ_files.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar19 + -8);
      local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5c8,lVar6,
                 *(long *)((long)&((organ_files.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar19) + lVar6);
      imrt::Volume::Volume((Volume *)&P,&collimator,&local_5c8);
      std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::emplace_back<imrt::Volume>
                (&volumes,(Volume *)&P);
      std::
      _Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   *)&P.angle2station);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
        operator_delete(local_5c8._M_dataplus._M_p);
      }
      uVar17 = uVar17 + 1;
      lVar19 = lVar19 + 0x20;
    } while (uVar17 < (ulong)((long)organ_files.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)organ_files.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  puVar12 = (undefined8 *)operator_new(0x28);
  puVar12[2] = 0;
  puVar12[3] = 0;
  *puVar12 = 0;
  puVar12[1] = 0;
  puVar12[4] = 0;
  lVar19 = 0;
  puVar18 = puVar12;
  do {
    pSVar13 = (Station *)operator_new(0x170);
    imrt::Station::Station(pSVar13,&collimator,&volumes,(int)lVar19,4,0x1c,0,2,-1,6,(fstream *)0x0);
    imrt::Station::generateIntensity(pSVar13);
    imrt::Station::printIntensity(pSVar13,false);
    *puVar18 = pSVar13;
    lVar19 = lVar19 + 0x46;
    puVar18 = puVar18 + 1;
  } while (lVar19 != 0x15e);
  ev = imrt::EvaluationFunction::getInstance(&volumes,&collimator);
  imrt::Plan::Plan(&P,ev);
  lVar19 = 0;
  do {
    imrt::Plan::add_station(&P,(Station *)puVar12[lVar19]);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 5);
  sb._M_t._M_impl._0_8_ = 0x3ff0000000000000;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3ff00000;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&sb;
  std::vector<double,_std::allocator<double>_>::vector(&w,__l,(allocator_type *)&Zmin);
  sb._M_t._M_impl._0_8_ = 0;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x4051800000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&sb;
  std::vector<double,_std::allocator<double>_>::vector(&Zmin,__l_00,(allocator_type *)&Zmax);
  sb._M_t._M_impl._0_8_ = 0x4049000000000000;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x40490000;
  sb._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x408f400000000000;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&sb;
  std::vector<double,_std::allocator<double>_>::vector(&Zmax,__l_01,(allocator_type *)&diff);
  local_6c0 = imrt::EvaluationFunction::eval(ev,&P,&w,&Zmin,&Zmax);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ev:",3);
  poVar14 = std::ostream::_M_insert<double>(local_6c0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  std::ostream::put((char)poVar14);
  std::ostream::flush();
  iVar16 = 0;
  do {
    imrt::EvaluationFunction::best_beamlets
              ((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
                *)&sb._M_t,ev,&P,10,10,0);
    p_Var15 = sb._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar10 = rand();
    uVar17 = (ulong)(long)iVar10 % sb._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if ((long)uVar17 < 1) {
      for (; uVar17 != 0; uVar17 = uVar17 + 1) {
        p_Var15 = (_Base_ptr)std::_Rb_tree_decrement(p_Var15);
      }
    }
    else {
      do {
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
    }
    pSVar13 = (Station *)p_Var15[1]._M_left;
    iVar10 = *(int *)&p_Var15[1]._M_right;
    cVar4 = *(char *)&p_Var15[1]._M_parent;
    iVar11 = rand();
    dVar8 = (double)(iVar11 % 3);
    if (cVar4 != '\0') {
      dVar8 = (double)((ulong)dVar8 ^ (ulong)DAT_00120010);
    }
    iVar11 = rand();
    imrt::Station::increaseIntensity_abi_cxx11_(&diff,pSVar13,iVar10,dVar8,iVar11 % 5);
    dVar8 = imrt::EvaluationFunction::incremental_eval(ev,pSVar13,&w,&Zmin,&Zmax,&diff);
    if (dVar8 <= local_6c0) {
      poVar14 = std::ostream::_M_insert<double>(dVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
      p_Var9 = diff.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      local_6c0 = dVar8;
    }
    else {
      imrt::Station::revert(pSVar13,&diff);
      imrt::EvaluationFunction::undo_last_eval(ev,&w,&Zmin,&Zmax);
      p_Var9 = diff.
               super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
    }
    while (p_Var9 != (_List_node_base *)&diff) {
      p_Var7 = p_Var9->_M_next;
      operator_delete(p_Var9);
      p_Var9 = p_Var7;
    }
    std::
    _Rb_tree<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::_Identity<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
    ::~_Rb_tree(&sb._M_t);
    iVar16 = iVar16 + 1;
  } while (iVar16 != 100);
  lVar19 = 0;
  do {
    imrt::Station::printIntensity((Station *)puVar12[lVar19],false);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"best_eval:",10);
  poVar14 = std::ostream::_M_insert<double>(local_6c0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  std::ostream::put((char)poVar14);
  std::ostream::flush();
  dVar8 = imrt::EvaluationFunction::eval(ev,&P,&w,&Zmin,&Zmax);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ev:",3);
  poVar14 = std::ostream::_M_insert<double>(dVar8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  std::ostream::put((char)poVar14);
  std::ostream::flush();
  imrt::EvaluationFunction::generate_voxel_dose_functions(ev);
  system("python plotter/plot.py");
  if (Zmax.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(Zmax.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (Zmin.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(Zmin.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  imrt::Plan::~Plan(&P);
  operator_delete(puVar12);
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector(&volumes);
  imrt::Collimator::~Collimator(&collimator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&organ_files);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&coord_files);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)file._M_dataplus._M_p != &file.field_2) {
    operator_delete(file._M_dataplus._M_p);
  }
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Positional(&_file);
  args::FlagBase::~FlagBase((FlagBase *)&help);
  args::ArgumentParser::~ArgumentParser(&parser);
  return 0;
}

Assistant:

int main(int argc, char** argv){

	args::ArgumentParser parser("********* IMRT-Solver *********", "An IMRT Solver.");
	args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
	//args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
	//args::ValueFlag<double> _min_fr(parser, "double", "Minimum volume occupied by a block (proportion)", {"min_fr"});
	//args::Flag trace(parser, "trace", "Trace", {"trace"});
	args::Positional<std::string> _file(parser, "instance", "Instance");

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

	string file=_file.Get();

	vector< pair<int, string> > coord_files(5);
	coord_files[0]=(make_pair(0,"data/CERR_Prostate/CoordinatesBeam_0.txt"));
	coord_files[1]=(make_pair(70,"data/CERR_Prostate/CoordinatesBeam_70.txt"));
	coord_files[2]=(make_pair(140,"data/CERR_Prostate/CoordinatesBeam_140.txt"));
	coord_files[3]=(make_pair(210,"data/CERR_Prostate/CoordinatesBeam_210.txt"));
	coord_files[4]=(make_pair(280,"data/CERR_Prostate/CoordinatesBeam_280.txt"));

	vector<string> organ_files;
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_BLADDER.dat");
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_RECTUM.dat");
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_PTVHD.dat");

  	Collimator collimator(coord_files);
  //	collimator.printAxisValues();
  //	collimator.printActiveBeam();

	vector<Volume> volumes;

  for (int i=0; i<organ_files.size(); i++) {
	  volumes.push_back(Volume(collimator, organ_files[i]));
	}

   //volumes[0].print_deposition();

   vector<Station*> stations(5);
   Station* station;
   for(int i=0;i<5;i++){
	   station = new Station(collimator,volumes, i*70, 4);
	   station->generateIntensity();
	   station->printIntensity();
	   stations[i]=station;
   }

   EvaluationFunction& F = EvaluationFunction::getInstance(volumes,collimator);
   Plan P(F);
   for(int i=0;i<5;i++)
	   P.add_station(*stations[i]);


	vector<double> w={1,1,1};
	vector<double> Zmin={0,0,70};
	vector<double> Zmax={50,50,1000};

	double best_eval=F.eval(P,w,Zmin,Zmax);
	cout << "ev:" << best_eval << endl;

	for(int i=0;i<100;i++){
		auto sb=F.best_beamlets(P, 10, 10);
		auto it=sb.begin();
		std::advance(it,rand()%sb.size());

		Station*s = it->second.first; int beamlet=it->second.second;
		bool sign=it->first.second;

		//cout << eval_beamlet << endl;

		double intensity=rand()%3;
		if(sign) intensity*=-1;

		double ratio= rand()%5 ;
		//if(eval_beamlet<0) intensity=-intensity;


		auto diff=s->increaseIntensity(beamlet,intensity,ratio);
		double eval=F.incremental_eval(*s,w,Zmin,Zmax, diff);

		if(eval > best_eval){ //reject the move
			s->revert(diff);
			F.undo_last_eval(w,Zmin,Zmax);
		}else{ //accept the move
			cout << eval << endl;
			best_eval=eval;
		}
	}

	for(int i=0;i<5;i++)
		stations[i]->printIntensity();

	cout << "best_eval:" << best_eval << endl;

	best_eval=F.eval(P,w,Zmin,Zmax);
		cout << "ev:" << best_eval << endl;

  F.generate_voxel_dose_functions ();
  system("python plotter/plot.py");

	return 0;

}